

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::mask_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          Image *mask)

{
  long x_00;
  runtime_error *this_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint64_t b;
  uint64_t g;
  uint64_t a;
  long local_98;
  uint64_t local_90;
  Image *local_88;
  uint64_t local_80;
  uint64_t local_78;
  long local_70;
  long local_68;
  ulong local_60;
  long local_58;
  Image *local_50;
  long local_48;
  long local_40;
  uint64_t local_38;
  
  uVar1 = source->width;
  uVar7 = source->height;
  if (w < 0) {
    w = uVar1;
  }
  if (h < 0) {
    h = uVar7;
  }
  local_88 = this;
  local_50 = source;
  if (((ulong)w <= (ulong)mask->width) && ((ulong)h <= (ulong)mask->height)) {
    uVar2 = sx >> 0x3f & sx;
    local_40 = x - uVar2;
    lVar5 = 0;
    if (sx < 1) {
      sx = lVar5;
    }
    uVar3 = sy >> 0x3f & sy;
    local_68 = y - uVar3;
    if (sy < 1) {
      sy = lVar5;
    }
    local_58 = 0;
    if (0 < local_40) {
      local_58 = local_40;
    }
    if (-1 < local_40) {
      local_40 = lVar5;
    }
    uVar2 = uVar2 + w + local_40;
    local_40 = sx - local_40;
    local_70 = 0;
    if (0 < local_68) {
      local_70 = local_68;
    }
    if (-1 < local_68) {
      local_68 = lVar5;
    }
    uVar4 = uVar3 + h + local_68;
    local_68 = sy - local_68;
    uVar3 = uVar1 - local_40;
    if ((long)(uVar2 + local_40) <= (long)uVar1) {
      uVar3 = uVar2;
    }
    uVar1 = uVar7 - local_68;
    if ((long)(uVar4 + local_68) <= (long)uVar7) {
      uVar1 = uVar4;
    }
    uVar7 = this->width - local_58;
    if ((long)(uVar3 + local_58) <= this->width) {
      uVar7 = uVar3;
    }
    local_60 = this->height - local_70;
    if ((long)(uVar1 + local_70) <= this->height) {
      local_60 = uVar1;
    }
    if (0 < (long)local_60 && -1 < (long)(local_60 | uVar7)) {
      local_98 = 0;
      do {
        if (0 < (long)uVar7) {
          lVar5 = local_98 + local_68;
          local_48 = local_70 + local_98;
          lVar6 = 0;
          do {
            x_00 = local_40 + lVar6;
            read_pixel(mask,x_00,lVar5,&local_90,&local_78,&local_80,(uint64_t *)0x0);
            if (((local_90 != 0xff) || (local_78 != 0xff)) || (local_80 != 0xff)) {
              read_pixel(local_50,x_00,lVar5,&local_90,&local_78,&local_80,&local_38);
              write_pixel(local_88,local_58 + lVar6,local_48,local_90,local_78,local_80,local_38);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < (long)uVar7);
        }
        local_98 = local_98 + 1;
      } while (local_98 < (long)local_60);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"mask is too small to cover copied area");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Image::mask_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, const Image& mask) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  // The mask image must cover the entire area to be blitted, but it does NOT
  // have to cover the entire destination or source image. The mask is indexed
  // in source-space, though, so its upper-left corner must be aligned with the
  // source image's upper-left corner.
  if ((mask.get_width() < static_cast<size_t>(w)) ||
      (mask.get_height() < static_cast<size_t>(h))) {
    throw runtime_error("mask is too small to cover copied area");
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (ssize_t yy = 0; yy < h; yy++) {
    for (ssize_t xx = 0; xx < w; xx++) {
      uint64_t r, g, b, a;
      mask.read_pixel(sx + xx, sy + yy, &r, &g, &b);
      if (r == 0xFF && g == 0xFF && b == 0xFF) {
        continue;
      }
      source.read_pixel(sx + xx, sy + yy, &r, &g, &b, &a);
      this->write_pixel(x + xx, y + yy, r, g, b, a);
    }
  }
}